

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

string * google::protobuf::compiler::js::(anonymous_namespace)::FieldComments_abi_cxx11_
                   (FieldDescriptor *field,BytesMode bytes_mode)

{
  Type TVar1;
  int in_EDX;
  string *in_RDI;
  string *comments;
  FieldDescriptor *in_stack_ffffffffffffffe0;
  
  std::__cxx11::string::string((string *)in_RDI);
  TVar1 = FieldDescriptor::type(in_stack_ffffffffffffffe0);
  if ((TVar1 == TYPE_BYTES) && (in_EDX == 2)) {
    std::__cxx11::string::operator+=
              ((string *)in_RDI,
               " * Note that Uint8Array is not supported on all browsers.\n * @see http://caniuse.com/Uint8Array\n"
              );
  }
  return in_RDI;
}

Assistant:

std::string FieldComments(const FieldDescriptor* field, BytesMode bytes_mode) {
  std::string comments;
  if (field->type() == FieldDescriptor::TYPE_BYTES && bytes_mode == BYTES_U8) {
    comments +=
        " * Note that Uint8Array is not supported on all browsers.\n"
        " * @see http://caniuse.com/Uint8Array\n";
  }
  return comments;
}